

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmJoin<cmRange<std::_Rb_tree_const_iterator<std::basic_string_view<char,std::char_traits<char>>>>>
                   (string *__return_storage_ptr__,
                   cmRange<std::_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *rng,string_view separator)

{
  bool bVar1;
  reference pbVar2;
  _Self *__x;
  basic_ostream<char,_std::char_traits<char>_> *__os;
  _Self local_1c0;
  _Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_> end;
  _Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_> local_1a8;
  _Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_> it;
  ostringstream os;
  cmRange<std::_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *rng_local;
  string_view separator_local;
  
  bVar1 = cmRange<std::_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::empty(rng);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&it);
    local_1a8 = cmRange<std::_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::begin(rng);
    local_1c0._M_node =
         (_Base_ptr)
         cmRange<std::_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         ::end(rng);
    pbVar2 = std::_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>::
             operator*(&local_1a8);
    std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&it,*pbVar2);
    while( true ) {
      __x = std::_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>::
            operator++(&local_1a8);
      bVar1 = std::operator!=(__x,&local_1c0);
      if (!bVar1) break;
      __os = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&it,separator);
      pbVar2 = std::_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>
               ::operator*(&local_1a8);
      std::operator<<(__os,*pbVar2);
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&it);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmJoin(Range const& rng, cm::string_view separator)
{
  if (rng.empty()) {
    return std::string();
  }

  std::ostringstream os;
  auto it = rng.begin();
  auto const end = rng.end();
  os << *it;
  while (++it != end) {
    os << separator << *it;
  }
  return os.str();
}